

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O3

bool __thiscall HighsHessian::operator==(HighsHessian *this,HighsHessian *hessian)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  double *pdVar8;
  double *pdVar9;
  int iVar10;
  size_t sVar11;
  double *pdVar12;
  double *pdVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  
  iVar3 = this->dim_;
  iVar4 = hessian->dim_;
  piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar6 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar11 = (long)piVar5 - (long)piVar6;
  piVar7 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar11 == (long)(hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar7) {
    if (piVar5 == piVar6) {
      bVar15 = true;
    }
    else {
      iVar10 = bcmp(piVar6,piVar7,sVar11);
      bVar15 = iVar10 == 0;
    }
  }
  else {
    bVar15 = false;
  }
  piVar5 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar11 = (long)piVar6 - (long)piVar5;
  piVar7 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (sVar11 == (long)(hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar7) {
    if (piVar6 == piVar5) {
      bVar16 = true;
    }
    else {
      iVar10 = bcmp(piVar5,piVar7,sVar11);
      bVar16 = iVar10 == 0;
    }
  }
  else {
    bVar16 = false;
  }
  pdVar8 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar13 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar9 - (long)pdVar8 ==
      (long)(hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar13) {
    if (pdVar8 == pdVar9) {
      bVar14 = 1;
    }
    else {
      do {
        pdVar12 = pdVar8 + 1;
        dVar1 = *pdVar8;
        dVar2 = *pdVar13;
        bVar14 = -(dVar1 == dVar2) & 1;
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        pdVar13 = pdVar13 + 1;
        pdVar8 = pdVar12;
      } while (pdVar12 != pdVar9);
    }
  }
  else {
    bVar14 = 0;
  }
  return (bool)(iVar3 == iVar4 & bVar15 & bVar16 & bVar14);
}

Assistant:

bool HighsHessian::operator==(const HighsHessian& hessian) const {
  bool equal = true;
  equal = this->dim_ == hessian.dim_ && equal;
  equal = this->start_ == hessian.start_ && equal;
  equal = this->index_ == hessian.index_ && equal;
  equal = this->value_ == hessian.value_ && equal;
  return equal;
}